

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int ARKodeWriteParameters(void *arkode_mem,FILE *fp)

{
  FILE *in_RSI;
  long in_RDI;
  ARKodeMem ark_mem;
  int local_4;
  
  if (in_RDI == 0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0xb3d,"ARKodeWriteParameters",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    fprintf(in_RSI,"ARKODE solver parameters:\n");
    if ((*(double *)(in_RDI + 0x2a8) != 0.0) || (NAN(*(double *)(in_RDI + 0x2a8)))) {
      fprintf(in_RSI,"  Minimum step size = %.16g\n",*(undefined8 *)(in_RDI + 0x2a8));
    }
    if ((*(double *)(in_RDI + 0x2b0) != 0.0) || (NAN(*(double *)(in_RDI + 0x2b0)))) {
      fprintf(in_RSI,"  Maximum step size = %.16g\n",1.0 / *(double *)(in_RDI + 0x2b0));
    }
    if (*(int *)(in_RDI + 0x2e0) != 0) {
      fprintf(in_RSI,"  Fixed time-stepping enabled\n");
    }
    if (*(int *)(in_RDI + 0x18) == 2) {
      fprintf(in_RSI,"  User provided error weight function\n");
    }
    else {
      fprintf(in_RSI,"  Solver relative tolerance = %.16g\n",*(undefined8 *)(in_RDI + 0x20));
      if (*(int *)(in_RDI + 0x18) == 0) {
        fprintf(in_RSI,"  Solver absolute tolerance = %.16g\n",*(undefined8 *)(in_RDI + 0x28));
      }
      else {
        fprintf(in_RSI,"  Vector-valued solver absolute tolerance\n");
      }
    }
    if (*(int *)(in_RDI + 0x220) == 0) {
      if (*(int *)(in_RDI + 0x1c) == 2) {
        fprintf(in_RSI,"  User provided residual weight function\n");
      }
      else if (*(int *)(in_RDI + 0x1c) == 0) {
        fprintf(in_RSI,"  Absolute residual tolerance = %.16g\n",*(undefined8 *)(in_RDI + 0x40));
      }
      else {
        fprintf(in_RSI,"  Vector-valued residual absolute tolerance\n");
      }
    }
    if ((*(double *)(in_RDI + 0x298) != 0.0) || (NAN(*(double *)(in_RDI + 0x298)))) {
      fprintf(in_RSI,"  Initial step size = %.16g\n",*(undefined8 *)(in_RDI + 0x298));
    }
    fprintf(in_RSI,"\n");
    fprintf(in_RSI,"  Maximum step increase (first step) = %.16g\n",
            *(undefined8 *)(*(long *)(in_RDI + 0x2e8) + 8));
    fprintf(in_RSI,"  Step reduction factor on multiple error fails = %.16g\n",
            *(undefined8 *)(*(long *)(in_RDI + 0x2e8) + 0x10));
    fprintf(in_RSI,"  Minimum error fails before above factor is used = %i\n",
            (ulong)*(uint *)(*(long *)(in_RDI + 0x2e8) + 0x20));
    fprintf(in_RSI,"  Step reduction factor on nonlinear convergence failure = %.16g\n",
            *(undefined8 *)(*(long *)(in_RDI + 0x2e8) + 0x28));
    fprintf(in_RSI,"  Explicit safety factor = %.16g\n",
            *(undefined8 *)(*(long *)(in_RDI + 0x2e8) + 0x30));
    fprintf(in_RSI,"  Safety factor = %.16g\n",*(undefined8 *)(*(long *)(in_RDI + 0x2e8) + 0x38));
    fprintf(in_RSI,"  Growth factor = %.16g\n",*(undefined8 *)(*(long *)(in_RDI + 0x2e8) + 0x40));
    fprintf(in_RSI,"  Step growth lower bound = %.16g\n",
            *(undefined8 *)(*(long *)(in_RDI + 0x2e8) + 0x48));
    fprintf(in_RSI,"  Step growth upper bound = %.16g\n",
            *(undefined8 *)(*(long *)(in_RDI + 0x2e8) + 0x50));
    if (*(code **)(*(long *)(in_RDI + 0x2e8) + 0x78) == arkExpStab) {
      fprintf(in_RSI,"  Default explicit stability function\n");
    }
    else {
      fprintf(in_RSI,"  User provided explicit stability function\n");
    }
    SUNAdaptController_Write(*(undefined8 *)(*(long *)(in_RDI + 0x2e8) + 0x68),in_RSI);
    fprintf(in_RSI,"  Maximum number of error test failures = %i\n",(ulong)*(uint *)(in_RDI + 0x300)
           );
    fprintf(in_RSI,"  Maximum number of convergence test failures = %i\n",
            (ulong)*(uint *)(in_RDI + 0x304));
    if (*(long *)(in_RDI + 0xb8) == 0) {
      local_4 = 0;
    }
    else {
      local_4 = (**(code **)(in_RDI + 0xb8))(in_RDI,in_RSI);
    }
  }
  return local_4;
}

Assistant:

int ARKodeWriteParameters(void* arkode_mem, FILE* fp)
{
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* print integrator parameters to file */
  fprintf(fp, "ARKODE solver parameters:\n");
  if (ark_mem->hmin != ZERO)
  {
    fprintf(fp, "  Minimum step size = %" RSYM "\n", ark_mem->hmin);
  }
  if (ark_mem->hmax_inv != ZERO)
  {
    fprintf(fp, "  Maximum step size = %" RSYM "\n", ONE / ark_mem->hmax_inv);
  }
  if (ark_mem->fixedstep) { fprintf(fp, "  Fixed time-stepping enabled\n"); }
  if (ark_mem->itol == ARK_WF)
  {
    fprintf(fp, "  User provided error weight function\n");
  }
  else
  {
    fprintf(fp, "  Solver relative tolerance = %" RSYM "\n", ark_mem->reltol);
    if (ark_mem->itol == ARK_SS)
    {
      fprintf(fp, "  Solver absolute tolerance = %" RSYM "\n", ark_mem->Sabstol);
    }
    else { fprintf(fp, "  Vector-valued solver absolute tolerance\n"); }
  }
  if (!ark_mem->rwt_is_ewt)
  {
    if (ark_mem->ritol == ARK_WF)
    {
      fprintf(fp, "  User provided residual weight function\n");
    }
    else
    {
      if (ark_mem->ritol == ARK_SS)
      {
        fprintf(fp, "  Absolute residual tolerance = %" RSYM "\n",
                ark_mem->SRabstol);
      }
      else { fprintf(fp, "  Vector-valued residual absolute tolerance\n"); }
    }
  }
  if (ark_mem->hin != ZERO)
  {
    fprintf(fp, "  Initial step size = %" RSYM "\n", ark_mem->hin);
  }
  fprintf(fp, "\n");
  fprintf(fp, "  Maximum step increase (first step) = %" RSYM "\n",
          ark_mem->hadapt_mem->etamx1);
  fprintf(fp, "  Step reduction factor on multiple error fails = %" RSYM "\n",
          ark_mem->hadapt_mem->etamxf);
  fprintf(fp, "  Minimum error fails before above factor is used = %i\n",
          ark_mem->hadapt_mem->small_nef);
  fprintf(fp,
          "  Step reduction factor on nonlinear convergence failure = %" RSYM
          "\n",
          ark_mem->hadapt_mem->etacf);
  fprintf(fp, "  Explicit safety factor = %" RSYM "\n", ark_mem->hadapt_mem->cfl);
  fprintf(fp, "  Safety factor = %" RSYM "\n", ark_mem->hadapt_mem->safety);
  fprintf(fp, "  Growth factor = %" RSYM "\n", ark_mem->hadapt_mem->growth);
  fprintf(fp, "  Step growth lower bound = %" RSYM "\n",
          ark_mem->hadapt_mem->lbound);
  fprintf(fp, "  Step growth upper bound = %" RSYM "\n",
          ark_mem->hadapt_mem->ubound);
  if (ark_mem->hadapt_mem->expstab == arkExpStab)
  {
    fprintf(fp, "  Default explicit stability function\n");
  }
  else { fprintf(fp, "  User provided explicit stability function\n"); }
  (void)SUNAdaptController_Write(ark_mem->hadapt_mem->hcontroller, fp);

  fprintf(fp, "  Maximum number of error test failures = %i\n", ark_mem->maxnef);
  fprintf(fp, "  Maximum number of convergence test failures = %i\n",
          ark_mem->maxncf);

  /* Call stepper routine (if provided) */
  if (ark_mem->step_writeparameters)
  {
    return (ark_mem->step_writeparameters(ark_mem, fp));
  }

  return (ARK_SUCCESS);
}